

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

string * cmsys::SystemTools::FindLibrary
                   (string *__return_storage_ptr__,string *name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *userPaths)

{
  bool bVar1;
  int iVar2;
  string *p;
  pointer pbVar3;
  string tryPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (((name->_M_string_length == 0) || (iVar2 = access((name->_M_dataplus)._M_p,4), iVar2 != 0)) ||
     (bVar1 = FileIsDirectory(name), bVar1)) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetPath(&local_48,(char *)0x0);
    pbVar3 = (userPaths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar3 != (userPaths->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_48,pbVar3);
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != (userPaths->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar3 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if ((pbVar3->_M_string_length == 0) ||
           ((pbVar3->_M_dataplus)._M_p[pbVar3->_M_string_length - 1] != '/')) {
          std::__cxx11::string::append((char *)pbVar3);
        }
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar3 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__cxx11::string::_M_assign((string *)&local_68);
        std::__cxx11::string::append((char *)&local_68);
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)(name->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_68);
        if (((local_68._M_string_length != 0) &&
            (iVar2 = access(local_68._M_dataplus._M_p,4), iVar2 == 0)) &&
           (bVar1 = FileIsDirectory(&local_68), !bVar1)) {
LAB_0010de73:
          CollapseFullPath(__return_storage_ptr__,&local_68,(char *)0x0);
          goto LAB_0010de84;
        }
        std::__cxx11::string::_M_assign((string *)&local_68);
        std::__cxx11::string::append((char *)&local_68);
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)(name->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_68);
        if (((local_68._M_string_length != 0) &&
            (iVar2 = access(local_68._M_dataplus._M_p,4), iVar2 == 0)) &&
           (bVar1 = FileIsDirectory(&local_68), !bVar1)) goto LAB_0010de73;
        std::__cxx11::string::_M_assign((string *)&local_68);
        std::__cxx11::string::append((char *)&local_68);
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)(name->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_68);
        if (((local_68._M_string_length != 0) &&
            (iVar2 = access(local_68._M_dataplus._M_p,4), iVar2 == 0)) &&
           (bVar1 = FileIsDirectory(&local_68), !bVar1)) goto LAB_0010de73;
        std::__cxx11::string::_M_assign((string *)&local_68);
        std::__cxx11::string::append((char *)&local_68);
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)(name->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_68);
        if (((local_68._M_string_length != 0) &&
            (iVar2 = access(local_68._M_dataplus._M_p,4), iVar2 == 0)) &&
           (bVar1 = FileIsDirectory(&local_68), !bVar1)) goto LAB_0010de73;
        std::__cxx11::string::_M_assign((string *)&local_68);
        std::__cxx11::string::append((char *)&local_68);
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)(name->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_68);
        if (((local_68._M_string_length != 0) &&
            (iVar2 = access(local_68._M_dataplus._M_p,4), iVar2 == 0)) &&
           (bVar1 = FileIsDirectory(&local_68), !bVar1)) goto LAB_0010de73;
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0010de84:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  else {
    CollapseFullPath(__return_storage_ptr__,name,(char *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools
::FindLibrary(const kwsys_stl::string& name,
              const kwsys_stl::vector<kwsys_stl::string>& userPaths)
{
  // See if the executable exists as written.
  if(SystemTools::FileExists(name) &&
     !SystemTools::FileIsDirectory(name))
    {
    return SystemTools::CollapseFullPath(name);
    }

  // Add the system search path to our path.
  kwsys_stl::vector<kwsys_stl::string> path;
  SystemTools::GetPath(path);
   // now add the additional paths
  {
  for(kwsys_stl::vector<kwsys_stl::string>::const_iterator i = userPaths.begin();
        i != userPaths.end(); ++i)
    {
    path.push_back(*i);
    }
  }
  // Add a trailing slash to all paths to aid the search process.
  {
  for(kwsys_stl::vector<kwsys_stl::string>::iterator i = path.begin();
      i != path.end(); ++i)
    {
    kwsys_stl::string& p = *i;
    if(p.empty() || *p.rbegin() != '/')
      {
      p += "/";
      }
    }
  }
  kwsys_stl::string tryPath;
  for(kwsys_stl::vector<kwsys_stl::string>::const_iterator p = path.begin();
      p != path.end(); ++p)
    {
#if defined(__APPLE__)
    tryPath = *p;
    tryPath += name;
    tryPath += ".framework";
    if(SystemTools::FileExists(tryPath)
       && SystemTools::FileIsDirectory(tryPath))
      {
      return SystemTools::CollapseFullPath(tryPath);
      }
#endif
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
    tryPath = *p;
    tryPath += name;
    tryPath += ".lib";
    if(SystemTools::FileExists(tryPath)
       && !SystemTools::FileIsDirectory(tryPath))
      {
      return SystemTools::CollapseFullPath(tryPath);
      }
#else
    tryPath = *p;
    tryPath += "lib";
    tryPath += name;
    tryPath += ".so";
    if(SystemTools::FileExists(tryPath)
       && !SystemTools::FileIsDirectory(tryPath))
      {
      return SystemTools::CollapseFullPath(tryPath);
      }
    tryPath = *p;
    tryPath += "lib";
    tryPath += name;
    tryPath += ".a";
    if(SystemTools::FileExists(tryPath)
       && !SystemTools::FileIsDirectory(tryPath))
      {
      return SystemTools::CollapseFullPath(tryPath);
      }
    tryPath = *p;
    tryPath += "lib";
    tryPath += name;
    tryPath += ".sl";
    if(SystemTools::FileExists(tryPath)
       && !SystemTools::FileIsDirectory(tryPath))
      {
      return SystemTools::CollapseFullPath(tryPath);
      }
    tryPath = *p;
    tryPath += "lib";
    tryPath += name;
    tryPath += ".dylib";
    if(SystemTools::FileExists(tryPath)
       && !SystemTools::FileIsDirectory(tryPath))
      {
      return SystemTools::CollapseFullPath(tryPath);
      }
    tryPath = *p;
    tryPath += "lib";
    tryPath += name;
    tryPath += ".dll";
    if(SystemTools::FileExists(tryPath)
       && !SystemTools::FileIsDirectory(tryPath))
      {
      return SystemTools::CollapseFullPath(tryPath);
      }
#endif
    }

  // Couldn't find the library.
  return "";
}